

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void __thiscall
QInternalMessageLogContext::populateBacktrace(QInternalMessageLogContext *this,int frameCount)

{
  long lVar1;
  int iVar2;
  enable_if_t<is_constructible_v<QVarLengthArray<void_*,_32LL>,_int>,_QVarLengthArray<void_*,_32LL>_&>
  this_00;
  void **sz;
  ulong uVar3;
  long in_FS_OFFSET;
  int n;
  BacktraceStorage *result;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = std::optional<QVarLengthArray<void_*,_32LL>_>::emplace<int>
                      ((optional<QVarLengthArray<void_*,_32LL>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  sz = QVLABase<void_*>::data(&this_00->super_QVLABase<void_*>);
  uVar3 = QVLABaseBase::size((QVLABaseBase *)this_00);
  iVar2 = backtrace(sz,uVar3 & 0xffffffff);
  if (iVar2 < 1) {
    QVLABase<void_*>::clear(&this_00->super_QVLABase<void_*>);
  }
  else {
    QVarLengthArray<void_*,_32LL>::resize
              ((QVarLengthArray<void_*,_32LL> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
               (qsizetype)sz);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void QInternalMessageLogContext::populateBacktrace(int frameCount)
{
    assert(frameCount >= 0);
    BacktraceStorage &result = backtrace.emplace(TypicalBacktraceFrameCount + frameCount);
    int n = ::backtrace(result.data(), result.size());
    if (n <= 0)
        result.clear();
    else
        result.resize(n);
}